

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_cid.c
# Opt level: O2

void do_mark_pending(quicly_local_cid_set_t *set,size_t idx)

{
  uint8_t *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint64_t uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  uint64_t uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  quicly_local_cid_t *pqVar14;
  long lVar15;
  uint8_t *puVar16;
  quicly_local_cid_t tmp;
  
  pqVar14 = set->cids + idx;
  pqVar14->state = QUICLY_LOCAL_CID_STATE_PENDING;
  lVar15 = idx + 1;
  puVar1 = set[-1].cids[3].cid.cid + 0x10;
  do {
    puVar16 = puVar1;
    lVar15 = lVar15 + -1;
    if (lVar15 == 0) {
      return;
    }
    puVar1 = puVar16 + 0x38;
  } while (*(int *)(puVar16 + 0x38) == 1);
  uVar2 = *(undefined8 *)(puVar16 + 0x68);
  uVar3 = *(undefined8 *)puVar1;
  uVar4 = *(uint64_t *)(puVar16 + 0x40);
  uVar5 = *(undefined8 *)(puVar16 + 0x48);
  uVar6 = *(undefined8 *)(puVar16 + 0x50);
  uVar7 = *(undefined8 *)(puVar16 + 0x58);
  uVar8 = *(undefined8 *)(puVar16 + 0x60);
  *(undefined8 *)(puVar16 + 0x68) = *(undefined8 *)(set->cids[idx].stateless_reset_token + 0xb);
  uVar9 = *(undefined8 *)pqVar14;
  uVar10 = set->cids[idx].sequence;
  uVar11 = *(undefined8 *)set->cids[idx].cid.cid;
  uVar12 = *(undefined8 *)(set->cids[idx].cid.cid + 8);
  uVar13 = *(undefined8 *)(set->cids[idx].stateless_reset_token + 3);
  *(undefined8 *)(puVar16 + 0x58) = *(undefined8 *)(set->cids[idx].cid.cid + 0x10);
  *(undefined8 *)(puVar16 + 0x60) = uVar13;
  *(undefined8 *)(puVar16 + 0x48) = uVar11;
  *(undefined8 *)(puVar16 + 0x50) = uVar12;
  *(undefined8 *)puVar1 = uVar9;
  *(uint64_t *)(puVar16 + 0x40) = uVar10;
  *(undefined8 *)(set->cids[idx].stateless_reset_token + 0xb) = uVar2;
  *(undefined8 *)(set->cids[idx].cid.cid + 0x10) = uVar7;
  *(undefined8 *)(set->cids[idx].stateless_reset_token + 3) = uVar8;
  *(undefined8 *)set->cids[idx].cid.cid = uVar5;
  *(undefined8 *)(set->cids[idx].cid.cid + 8) = uVar6;
  *(undefined8 *)pqVar14 = uVar3;
  set->cids[idx].sequence = uVar4;
  return;
}

Assistant:

static void do_mark_pending(quicly_local_cid_set_t *set, size_t idx)
{
    set->cids[idx].state = QUICLY_LOCAL_CID_STATE_PENDING;
    for (size_t j = 0; j < idx; j++) {
        if (set->cids[j].state != QUICLY_LOCAL_CID_STATE_PENDING) {
            swap_cids(&set->cids[idx], &set->cids[j]);
            break;
        }
    }
}